

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

Vec_Ptr_t * Llb_Nonlin4Group(DdManager *dd,Vec_Ptr_t *vParts,Vec_Int_t *vVars2Q,int nSizeMax)

{
  uint uVar1;
  uint uVar2;
  Llb_Prt_t *pLVar3;
  DdNode *pDVar4;
  int iVar5;
  int iVar6;
  Llb_Mgr_t_conflict *p;
  long lVar7;
  void **ppvVar8;
  long lVar9;
  long lVar10;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Vec_Ptr_t *local_48;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  p = Llb_Nonlin4Alloc(dd,vParts,(DdNode *)0x0,vVars2Q,nSizeMax);
  if (0 < p->iPartFree) {
    lVar10 = 0;
    do {
      pLVar3 = p->pParts[lVar10];
      if (pLVar3 != (Llb_Prt_t *)0x0) {
        lVar7 = (long)pLVar3->vVars->nSize;
        if (0 < lVar7) {
          lVar9 = 0;
          do {
            if (p->pVars[pLVar3->vVars->pArray[lVar9]]->vParts->nSize == 1) {
              Llb_Nonlin4Quantify1(p,pLVar3);
              break;
            }
            lVar9 = lVar9 + 1;
          } while (lVar7 != lVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->iPartFree);
  }
  Llb_Nonlin4RecomputeScores(p);
  iVar5 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
  if (iVar5 != 0) {
    local_48 = (Vec_Ptr_t *)0x0;
    do {
      iVar5 = Cudd_ReadReorderings(dd);
      iVar6 = Llb_Nonlin4Quantify2(p,local_38,local_40);
      if (iVar6 == 0) goto LAB_0082ea94;
      iVar6 = Cudd_ReadReorderings(dd);
      if (iVar5 < iVar6) {
        Llb_Nonlin4RecomputeScores(p);
      }
      iVar5 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
    } while (iVar5 != 0);
  }
  local_48 = (Vec_Ptr_t *)malloc(0x10);
  local_48->nCap = 1000;
  local_48->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  local_48->pArray = ppvVar8;
  if (0 < p->iPartFree) {
    lVar10 = 0;
    do {
      pLVar3 = p->pParts[lVar10];
      if (pLVar3 != (Llb_Prt_t *)0x0) {
        pDVar4 = pLVar3->bFunc;
        if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
          if (((ulong)pDVar4 & 1) != 0) {
            __assert_fail("!Cudd_IsComplement(pPart->bFunc)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                          ,0x34a,
                          "Vec_Ptr_t *Llb_Nonlin4Group(DdManager *, Vec_Ptr_t *, Vec_Int_t *, int)")
            ;
          }
        }
        else {
          uVar1 = local_48->nSize;
          uVar2 = local_48->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (local_48->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(local_48->pArray,0x80);
              }
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar2 * 2;
              if (iVar5 <= (int)uVar2) goto LAB_0082ea5c;
              if (local_48->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(local_48->pArray,(ulong)uVar2 << 4);
              }
            }
            local_48->pArray = ppvVar8;
            local_48->nCap = iVar5;
          }
LAB_0082ea5c:
          local_48->nSize = uVar1 + 1;
          local_48->pArray[(int)uVar1] = pDVar4;
          Cudd_Ref(pLVar3->bFunc);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->iPartFree);
  }
LAB_0082ea94:
  Llb_Nonlin4Free(p);
  return local_48;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Group( DdManager * dd, Vec_Ptr_t * vParts, Vec_Int_t * vVars2Q, int nSizeMax )
{
    Vec_Ptr_t * vGroups;
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    int i, nReorders;//, clk = Abc_Clock();
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, NULL, vVars2Q, nSizeMax );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    vGroups = Vec_PtrAlloc( 1000 );
    Llb_MgrForEachPart( p, pPart, i )
    {
//printf( "Iteration %d ", pPart->iPart );
        if ( Cudd_IsConstant(pPart->bFunc) )
        {
//printf( "Constant\n" );
            assert( !Cudd_IsComplement(pPart->bFunc) );
            continue;
        }
//printf( "\n" );
        Vec_PtrPush( vGroups, pPart->bFunc );
        Cudd_Ref( pPart->bFunc );
//printf( "Part %d  ", pPart->iPart );
//Extra_bddPrintSupport( p->dd, pPart->bFunc ); printf( "\n" );
    }
    Llb_Nonlin4Free( p );
//Abc_PrintTime( 1, "Reparametrization time", Abc_Clock() - clk );
    return vGroups;
}